

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar1.cpp
# Opt level: O0

int main(int argc,char **arg)

{
  byte bVar1;
  char cVar2;
  ostream *poVar3;
  char local_320 [8];
  ofstream ofs;
  Mat local_118 [4];
  int c;
  undefined4 local_b8;
  Mat local_a8 [8];
  Mat frame;
  VideoCapture local_48 [8];
  VideoCapture capture;
  char **arg_local;
  int argc_local;
  
  cv::VideoCapture::VideoCapture(local_48,0,0);
  cv::Mat::Mat(local_a8);
  bVar1 = cv::CascadeClassifier::load((string *)hand_classifier);
  if ((bVar1 & 1) == 0) {
    printf("--(!)Error loading\n");
    arg_local._4_4_ = -1;
    local_b8 = 1;
  }
  else {
    bVar1 = cv::CascadeClassifier::load((string *)fist_classifier);
    if ((bVar1 & 1) == 0) {
      printf(" Error \n");
      arg_local._4_4_ = -1;
      local_b8 = 1;
    }
    else {
      bVar1 = cv::CascadeClassifier::load((string *)face_classifier);
      if ((bVar1 & 1) == 0) {
        printf(" Error \n");
        arg_local._4_4_ = -1;
        local_b8 = 1;
      }
      else {
        printf("done!\n");
        do {
          cv::VideoCapture::operator>>(local_48,local_a8);
          bVar1 = cv::Mat::empty();
          if ((bVar1 & 1) != 0) {
            printf(" --(!) No captured frame -- Break!");
            break;
          }
          cv::Mat::Mat(local_118,local_a8);
          detectAndDisplay(local_118);
          cv::Mat::~Mat(local_118);
          cVar2 = cv::waitKey(10);
        } while (cVar2 != 'q');
        std::ofstream::close();
        poVar3 = std::operator<<((ostream *)&std::cout,"cmae");
        std::operator<<(poVar3,"\n");
        std::ofstream::ofstream(local_320);
        std::operator|(_S_out,_S_trunc);
        std::ofstream::open(local_320,0x10607f);
        std::ofstream::close();
        arg_local._4_4_ = 0;
        local_b8 = 1;
        std::ofstream::~ofstream(local_320);
      }
    }
  }
  cv::Mat::~Mat(local_a8);
  cv::VideoCapture::~VideoCapture(local_48);
  return arg_local._4_4_;
}

Assistant:

int main( int argc, const char** arg )
 {
   //char filename[] = "out.txt"
   //freopen ("out.txt", "w", stdout);
   VideoCapture capture(0);

   Mat frame;
   //-- 1. Load the cascades
   if(  !hand_classifier.load( hand_cascade_name ) ){ printf("--(!)Error loading\n"); return -1; }
   if ( !fist_classifier.load( fist_cascade_name) ) { printf(" Error \n"); return -1; }
   if ( !face_classifier.load( face_cascade_name)) { printf(" Error \n"); return -1; }
//   if ( !left_classifier.load( left_cascade_name)) { printf(" Error \n"); return -1; }
   else printf("done!\n");
   //-- 2. Read the video stream
     while( true )
     {
        capture >> frame;
   //-- 3. Apply the classifier to the frame
       if( !frame.empty() )
       { 
           detectAndDisplay( frame );
       }
       else
       { 
         printf(" --(!) No captured frame -- Break!"); break; 
       }
       int c = waitKey(10);
       if( (char)c == 'q' ) { break; }
       //if( (char)c == 'c' ) { goto L1; }
      }

      outfile.close();
      cout<<"cmae"<<"\n";
      //outfile2.close();
      //outfile3.close();
      //if (remove("out.txt")!=0) perror("File deletion failed");
      //else cout << "File deleted successfully"; 
      std::ofstream ofs;
      ofs.open("out.txt", std::ofstream::out | std::ofstream::trunc);
      ofs.close();
      //remove("fist.txt");
      //remove("face.txt");
      //fclose (stdout);
   return 0; 
 }